

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

bool __thiscall mp::NLSolver::LoadModel(NLSolver *this,NLModel *mdl)

{
  bool bVar1;
  pointer __p;
  NLFeeder_Easy nlf;
  NLFeeder_Easy local_2e0;
  
  NLFeeder_Easy::NLFeeder_Easy(&local_2e0,mdl,this->nl_opts_);
  NLFeeder_Easy::ExportPreproData(&local_2e0,&this->pd_);
  __p = (pointer)operator_new(0x110);
  memcpy(__p,&local_2e0.header_,0x110);
  std::__uniq_ptr_impl<mp::NLHeader,_std::default_delete<mp::NLHeader>_>::reset
            ((__uniq_ptr_impl<mp::NLHeader,_std::default_delete<mp::NLHeader>_> *)&this->p_nlheader_
             ,__p);
  bVar1 = LoadModel<mp::NLFeeder_Easy>(this,&local_2e0);
  NLFeeder_Easy::~NLFeeder_Easy(&local_2e0);
  return bVar1;
}

Assistant:

bool NLSolver::LoadModel(const NLModel& mdl) {
  NLFeeder_Easy nlf(mdl, nl_opts_);
  nlf.ExportPreproData(pd_);
  p_nlheader_.reset(new NLHeader(nlf.Header()));
  return LoadModel(nlf);
}